

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandResubstitute(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Abc_Ntk_t *pNtk_00;
  char *pcVar3;
  uint local_58;
  uint local_54;
  int fVeryVerbose;
  int fVerbose;
  int fUseZeros;
  int fUpdateLevel;
  int nLevelsOdc;
  int nNodesMax;
  int nCutsMax;
  int c;
  int RS_CUT_MAX;
  int RS_CUT_MIN;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  nLevelsOdc = 8;
  fUpdateLevel = 1;
  fUseZeros = 0;
  fVerbose = 1;
  bVar1 = false;
  local_54 = 0;
  local_58 = 0;
  Extra_UtilGetoptReset();
LAB_0026e0f6:
  do {
    iVar2 = Extra_UtilGetopt(argc,argv,"KNFlzvwh");
    if (iVar2 == -1) {
      if (pNtk_00 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        return 1;
      }
      if ((nLevelsOdc < 4) || (0x10 < nLevelsOdc)) {
        Abc_Print(-1,"Can only compute cuts for %d <= K <= %d.\n",4,0x10);
        return 1;
      }
      if ((fUpdateLevel < 0) || (3 < fUpdateLevel)) {
        Abc_Print(-1,"Can only resubstitute at most 3 nodes.\n");
        return 1;
      }
      iVar2 = Abc_NtkIsStrash(pNtk_00);
      if (iVar2 == 0) {
        Abc_Print(-1,"This command can only be applied to an AIG (run \"strash\").\n");
        return 1;
      }
      iVar2 = Abc_NtkGetChoiceNum(pNtk_00);
      if (iVar2 != 0) {
        Abc_Print(-1,"AIG resynthesis cannot be applied to AIGs with choice nodes.\n");
        return 1;
      }
      iVar2 = Abc_NtkResubstitute(pNtk_00,nLevelsOdc,fUpdateLevel,fUseZeros,fVerbose,local_54,
                                  local_58);
      if (iVar2 == 0) {
        Abc_Print(-1,"Refactoring has failed.\n");
        return 1;
      }
      return 0;
    }
    switch(iVar2) {
    case 0x46:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
        goto LAB_0026e3d5;
      }
      fUseZeros = atoi(argv[globalUtilOptind]);
      iVar2 = fUseZeros;
      break;
    default:
      goto LAB_0026e3d5;
    case 0x4b:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-K\" should be followed by an integer.\n");
        goto LAB_0026e3d5;
      }
      nLevelsOdc = atoi(argv[globalUtilOptind]);
      iVar2 = nLevelsOdc;
      break;
    case 0x4e:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
        goto LAB_0026e3d5;
      }
      fUpdateLevel = atoi(argv[globalUtilOptind]);
      iVar2 = fUpdateLevel;
      break;
    case 0x68:
      goto LAB_0026e3d5;
    case 0x6c:
      fVerbose = fVerbose ^ 1;
      goto LAB_0026e0f6;
    case 0x76:
      local_54 = local_54 ^ 1;
      goto LAB_0026e0f6;
    case 0x77:
      local_58 = local_58 ^ 1;
      goto LAB_0026e0f6;
    case 0x7a:
      bVar1 = (bool)(bVar1 ^ 1);
      goto LAB_0026e0f6;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar2 < 0) {
LAB_0026e3d5:
      Abc_Print(-2,"usage: resub [-KN <num>] [-lzvwh]\n");
      Abc_Print(-2,"\t           performs technology-independent restructuring of the AIG\n");
      Abc_Print(-2,"\t-K <num> : the max cut size (%d <= num <= %d) [default = %d]\n",4,0x10,
                (ulong)(uint)nLevelsOdc);
      Abc_Print(-2,"\t-N <num> : the max number of nodes to add (0 <= num <= 3) [default = %d]\n",
                (ulong)(uint)fUpdateLevel);
      Abc_Print(-2,"\t-F <num> : the number of fanout levels for ODC computation [default = %d]\n",
                (ulong)(uint)fUseZeros);
      pcVar3 = "no";
      if (fVerbose != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-l       : toggle preserving the number of levels [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (bVar1) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-z       : toggle using zero-cost replacements [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (local_54 != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v       : toggle verbose printout [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (local_58 != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-w       : toggle verbose printout of ODC computation [default = %s]\n",pcVar3
               );
      Abc_Print(-2,"\t-h       : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandResubstitute( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int RS_CUT_MIN =  4;
    int RS_CUT_MAX = 16;
    int c;
    int nCutsMax;
    int nNodesMax;
    int nLevelsOdc;
    int fUpdateLevel;
    int fUseZeros;
    int fVerbose;
    int fVeryVerbose;
    extern int Abc_NtkResubstitute( Abc_Ntk_t * pNtk, int nCutsMax, int nNodesMax, int nLevelsOdc, int fUpdateLevel, int fVerbose, int fVeryVerbose );

    // set defaults
    nCutsMax     =  8;
    nNodesMax    =  1;
    nLevelsOdc   =  0;
    fUpdateLevel =  1;
    fUseZeros    =  0;
    fVerbose     =  0;
    fVeryVerbose =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "KNFlzvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            nCutsMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCutsMax < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nNodesMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nNodesMax < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nLevelsOdc = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLevelsOdc < 0 )
                goto usage;
            break;
        case 'l':
            fUpdateLevel ^= 1;
            break;
        case 'z':
            fUseZeros ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( nCutsMax < RS_CUT_MIN || nCutsMax > RS_CUT_MAX )
    {
        Abc_Print( -1, "Can only compute cuts for %d <= K <= %d.\n", RS_CUT_MIN, RS_CUT_MAX );
        return 1;
    }
    if ( nNodesMax < 0 || nNodesMax > 3 )
    {
        Abc_Print( -1, "Can only resubstitute at most 3 nodes.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command can only be applied to an AIG (run \"strash\").\n" );
        return 1;
    }
    if ( Abc_NtkGetChoiceNum(pNtk) )
    {
        Abc_Print( -1, "AIG resynthesis cannot be applied to AIGs with choice nodes.\n" );
        return 1;
    }

    // modify the current network
    if ( !Abc_NtkResubstitute( pNtk, nCutsMax, nNodesMax, nLevelsOdc, fUpdateLevel, fVerbose, fVeryVerbose ) )
    {
        Abc_Print( -1, "Refactoring has failed.\n" );
        return 1;
    }
    return 0;

usage:
    Abc_Print( -2, "usage: resub [-KN <num>] [-lzvwh]\n" );
    Abc_Print( -2, "\t           performs technology-independent restructuring of the AIG\n" );
    Abc_Print( -2, "\t-K <num> : the max cut size (%d <= num <= %d) [default = %d]\n", RS_CUT_MIN, RS_CUT_MAX, nCutsMax );
    Abc_Print( -2, "\t-N <num> : the max number of nodes to add (0 <= num <= 3) [default = %d]\n", nNodesMax );
    Abc_Print( -2, "\t-F <num> : the number of fanout levels for ODC computation [default = %d]\n", nLevelsOdc );
    Abc_Print( -2, "\t-l       : toggle preserving the number of levels [default = %s]\n", fUpdateLevel? "yes": "no" );
    Abc_Print( -2, "\t-z       : toggle using zero-cost replacements [default = %s]\n", fUseZeros? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggle verbose printout [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggle verbose printout of ODC computation [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}